

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void __thiscall Matrix<double>::initialize(Matrix<double> *this,double beg,double end)

{
  time_t tVar1;
  reference this_00;
  reference pvVar2;
  double dVar3;
  uint local_28;
  uint local_24;
  uint j;
  uint i;
  double end_local;
  double beg_local;
  Matrix<double> *this_local;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  for (local_24 = 0; local_24 < (this->m_shape).n_row; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < (this->m_shape).n_col; local_28 = local_28 + 1) {
      dVar3 = get_random<double>(beg,end);
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&this->m_elems,(ulong)local_24);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)local_28);
      *pvVar2 = dVar3;
    }
  }
  return;
}

Assistant:

void Matrix<T>::initialize(T beg, T end){
    srand(time(0));

    for(unsigned i=0;i<m_shape.n_row;++i){
        for(unsigned j=0;j<m_shape.n_col;++j)
            m_elems[i][j]=get_random<T>(beg, end);
    }
}